

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndWasNotSet::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSettingMode in_R8D;
  FlagSaver fs;
  string value;
  string local_100;
  CommandLineFlagInfo local_e0;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest","NameExistsAndWasNotSet");
  SetCommandLineOptionWithMode_abi_cxx11_(&local_100,(gflags *)0x14c7dc,"800",(char *)0x2,in_R8D);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string((string *)&value,"will be changed",(allocator *)&local_e0);
  bVar1 = GetCommandLineOption("test_int32",&value);
  if (bVar1) {
    bVar1 = std::operator==("800",&value);
    if (!bVar1) {
      fprintf(_stderr,"Check failed: %s %s %s\n","\"800\"","==","value");
      goto LAB_0013716a;
    }
    GetCommandLineFlagInfoOrDie(&local_e0,"test_int32");
    CommandLineFlagInfo::~CommandLineFlagInfo(&local_e0);
    if (local_e0.is_default != false) {
      std::__cxx11::string::~string((string *)&value);
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar2 = "GetCommandLineFlagInfoOrDie(\"test_int32\").is_default";
  }
  else {
    pcVar2 = "r";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar2);
LAB_0013716a:
  exit(1);
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndWasNotSet) {
  // This doesn't set the flag's value, but rather its default value.
  // is_default is still true, but the 'default' value returned has changed!
  SetCommandLineOptionWithMode("test_int32", "800", SET_FLAGS_DEFAULT);
  string value("will be changed");
  const bool r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("800", value);
  EXPECT_TRUE(GetCommandLineFlagInfoOrDie("test_int32").is_default);
}